

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereIndexExprTrans(Index *pIdx,int iTabCur,int iIdxCur,WhereInfo *pWInfo)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ExprList *pEVar6;
  Table *pTVar7;
  Column *pCVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  Walker w;
  IdxExprTrans x;
  Walker local_b8;
  Walker local_88;
  Expr *local_58;
  int local_50;
  int local_4c;
  undefined4 local_48;
  int local_44;
  WhereInfo *local_40;
  sqlite3 *local_38;
  
  pEVar6 = pIdx->aColExpr;
  if ((pEVar6 != (ExprList *)0x0) || ((pIdx->field_0x64 & 4) != 0)) {
    pTVar7 = pIdx->pTable;
    local_b8.walkerDepth = 0;
    local_b8.eCode = 0;
    local_b8._38_2_ = 0;
    local_b8.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_b8.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_b8.pParse = (Parse *)0x0;
    local_b8.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
    local_b8.u.pNC = (NameContext *)&local_58;
    local_38 = pWInfo->pParse->db;
    if (pIdx->nColumn != 0) {
      uVar12 = 0;
      local_50 = iTabCur;
      local_4c = iIdxCur;
      local_40 = pWInfo;
LAB_0018a3bd:
      uVar4 = pIdx->aiColumn[uVar12];
      if ((short)uVar4 == -2) {
        local_58 = pEVar6->a[uVar12].pExpr;
        local_88.eCode = 1;
        local_88.xExprCallback = exprNodeIsConstant;
        local_88.xSelectCallback = sqlite3SelectWalkFail;
        local_88.u.n = 0;
        if (local_58 != (Expr *)0x0) {
          walkExpr(&local_88,local_58);
        }
        if (local_88.eCode != 0) goto LAB_0018a50c;
        local_b8.xExprCallback = whereIndexExprTransNode;
        goto LAB_0018a4be;
      }
      if (-1 < (short)uVar4) {
        pCVar8 = pTVar7->aCol;
        uVar5 = pCVar8[uVar4].colFlags;
        if ((uVar5 & 0x20) == 0) goto LAB_0018a50c;
        bVar13 = (uVar5 >> 9 & 1) != 0;
        if (bVar13) {
          if (bVar13) {
            pcVar9 = pCVar8[uVar4].zCnName + -1;
            do {
              pcVar10 = pcVar9 + 1;
              pcVar9 = pcVar9 + 1;
            } while (*pcVar10 != '\0');
            pcVar10 = pcVar9;
            if ((uVar5 & 4) != 0) {
              do {
                pcVar9 = pcVar10 + 1;
                pcVar1 = pcVar10 + 1;
                pcVar10 = pcVar9;
              } while (*pcVar1 != '\0');
            }
            pcVar9 = pcVar9 + 1;
          }
          else {
            pcVar9 = (char *)0x0;
          }
          lVar11 = 0;
          do {
            bVar2 = pcVar9[lVar11];
            bVar3 = "BINARY"[lVar11];
            if (bVar2 == bVar3) {
              if ((ulong)bVar2 == 0) goto LAB_0018a4ab;
            }
            else if (""[bVar2] != ""[bVar3]) goto LAB_0018a4ab;
            lVar11 = lVar11 + 1;
          } while( true );
        }
        goto LAB_0018a4b0;
      }
      goto LAB_0018a50c;
    }
  }
  return;
LAB_0018a4ab:
  if (bVar2 == bVar3) {
LAB_0018a4b0:
    local_b8.xExprCallback = whereIndexExprTransColumn;
    local_44 = (int)(short)uVar4;
LAB_0018a4be:
    local_48 = (undefined4)uVar12;
    if (pWInfo->pWhere != (Expr *)0x0) {
      walkExpr(&local_b8,pWInfo->pWhere);
    }
    sqlite3WalkExprList(&local_b8,pWInfo->pOrderBy);
    sqlite3WalkExprList(&local_b8,pWInfo->pResultSet);
  }
LAB_0018a50c:
  uVar12 = uVar12 + 1;
  if (pIdx->nColumn <= uVar12) {
    return;
  }
  goto LAB_0018a3bd;
}

Assistant:

static void whereIndexExprTrans(
  Index *pIdx,      /* The Index */
  int iTabCur,      /* Cursor of the table that is being indexed */
  int iIdxCur,      /* Cursor of the index itself */
  WhereInfo *pWInfo /* Transform expressions in this WHERE clause */
){
  int iIdxCol;               /* Column number of the index */
  ExprList *aColExpr;        /* Expressions that are indexed */
  Table *pTab;
  Walker w;
  IdxExprTrans x;
  aColExpr = pIdx->aColExpr;
  if( aColExpr==0 && !pIdx->bHasVCol ){
    /* The index does not reference any expressions or virtual columns
    ** so no translations are needed. */
    return;
  }
  pTab = pIdx->pTable;
  memset(&w, 0, sizeof(w));
  w.u.pIdxTrans = &x;
  x.iTabCur = iTabCur;
  x.iIdxCur = iIdxCur;
  x.pWInfo = pWInfo;
  x.db = pWInfo->pParse->db;
  for(iIdxCol=0; iIdxCol<pIdx->nColumn; iIdxCol++){
    i16 iRef = pIdx->aiColumn[iIdxCol];
    if( iRef==XN_EXPR ){
      assert( aColExpr!=0 && aColExpr->a[iIdxCol].pExpr!=0 );
      x.pIdxExpr = aColExpr->a[iIdxCol].pExpr;
      if( sqlite3ExprIsConstant(x.pIdxExpr) ) continue;
      w.xExprCallback = whereIndexExprTransNode;
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( iRef>=0
       && (pTab->aCol[iRef].colFlags & COLFLAG_VIRTUAL)!=0
       && ((pTab->aCol[iRef].colFlags & COLFLAG_HASCOLL)==0
           || sqlite3StrICmp(sqlite3ColumnColl(&pTab->aCol[iRef]),
                                               sqlite3StrBINARY)==0)
    ){
      /* Check to see if there are direct references to generated columns
      ** that are contained in the index.  Pulling the generated column
      ** out of the index is an optimization only - the main table is always
      ** available if the index cannot be used.  To avoid unnecessary
      ** complication, omit this optimization if the collating sequence for
      ** the column is non-standard */
      x.iTabCol = iRef;
      w.xExprCallback = whereIndexExprTransColumn;
#endif /* SQLITE_OMIT_GENERATED_COLUMNS */
    }else{
      continue;
    }
    x.iIdxCol = iIdxCol;
    sqlite3WalkExpr(&w, pWInfo->pWhere);
    sqlite3WalkExprList(&w, pWInfo->pOrderBy);
    sqlite3WalkExprList(&w, pWInfo->pResultSet);
  }
}